

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

void string_buffer_append_string(string_buffer_t *sb,char *str)

{
  int iVar1;
  size_t __n;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  
  if (sb == (string_buffer_t *)0x0) {
    __assert_fail("sb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                  ,0x18c,"void string_buffer_append_string(string_buffer_t *, const char *)");
  }
  if (str != (char *)0x0) {
    __n = strlen(str);
    sVar4 = sb->size;
    uVar2 = (ulong)sb->alloc;
    if (uVar2 <= __n + sVar4 + 1) {
      do {
        iVar1 = (int)uVar2 * 2;
        sb->alloc = iVar1;
        pcVar3 = (char *)realloc(sb->s,(long)iVar1);
        sb->s = pcVar3;
        sVar4 = sb->size;
        uVar2 = (ulong)sb->alloc;
      } while (uVar2 <= __n + 1 + sVar4);
    }
    memcpy(sb->s + sVar4,str,__n);
    sVar4 = sb->size + __n;
    sb->size = sVar4;
    sb->s[sVar4] = '\0';
    return;
  }
  __assert_fail("str != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/string_util.c"
                ,0x18d,"void string_buffer_append_string(string_buffer_t *, const char *)");
}

Assistant:

void string_buffer_append_string(string_buffer_t *sb, const char *str)
{
    assert(sb != NULL);
    assert(str != NULL);

    size_t len = strlen(str);

    while (sb->size+len + 1 >= sb->alloc) {
        sb->alloc *= 2;
        sb->s = realloc(sb->s, sb->alloc);
    }

    memcpy(&sb->s[sb->size], str, len);
    sb->size += len;
    sb->s[sb->size] = 0;
}